

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O2

char * cmGetDefinition(void *arg,char *def)

{
  char *pcVar1;
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,def,&local_31);
  pcVar1 = cmMakefile::GetDefinition((cmMakefile *)arg,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return pcVar1;
}

Assistant:

const char* CCONV cmGetDefinition(void *arg,const char*def)
{
  cmMakefile *mf = static_cast<cmMakefile *>(arg);
  return mf->GetDefinition(def);
}